

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

shared_ptr<DataSet> __thiscall DataSet::fromFile(DataSet *this,string *file_name)

{
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t f;
  ulong uVar1;
  long lVar2;
  shared_ptr<DataSet> sVar3;
  allocator_type local_261;
  size_t size;
  ulong local_258;
  vector<float,_std::allocator<float>_> vec;
  ifstream file;
  int aiStack_218 [122];
  
  std::make_shared<DataSet>();
  std::ifstream::ifstream(&file,(string *)file_name,_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(_file + -0x18)) == 0) {
    std::istream::read((char *)&file,this->num_features);
    std::istream::read((char *)&file,(long)&size);
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::reserve
              ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)(this->num_features + 8),size);
    uVar1 = 0;
    while (uVar1 < size) {
      local_258 = uVar1;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 &vec.super__Vector_base<float,_std::allocator<float>_>,
                 *(size_type *)this->num_features,&local_261);
      lVar2 = 0;
      for (uVar1 = 0; uVar1 < ((DataSet *)this->num_features)->num_features; uVar1 = uVar1 + 1) {
        std::istream::read((char *)&file,
                           (long)vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      }
      addVector((DataSet *)this->num_features,
                (vector<float,_std::allocator<float>_> *)
                &vec.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&vec.super__Vector_base<float,_std::allocator<float>_>);
      uVar1 = local_258 + 1;
    }
    std::ifstream::~ifstream(&file);
    sVar3.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<DataSet>)sVar3.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not load from file");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<DataSet> DataSet::fromFile(const std::string &file_name) {
  auto ds = std::make_shared<DataSet>();

  std::ifstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Read num features
    file.read((char *) &ds->num_features, sizeof(size_t));
    size_t size;
    // Read number of vectors
    file.read((char *) &size, sizeof(size_t));
    ds->vectors.reserve(size);
    for (size_t v = 0; v < size; v++) {
      std::vector<float> vec(ds->num_features);
      for (size_t f = 0; f < ds->num_features; f++) {
        file.read((char *) &vec[f], sizeof(float));
      }
      ds->addVector(vec);
    }
    return ds;
  } else {
    throw std::runtime_error("Could not load from file");
  }

}